

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_svd.h
# Opt level: O0

void math::internal::matrix_gk_svd<double>
               (double *mat_a,int rows,int cols,double *mat_u,double *vec_s,double *mat_v,
               double *epsilon)

{
  double *mat_v_00;
  double *mat_q_00;
  double *__result;
  double dVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  reference pvVar5;
  double *pdVar6;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  int local_128;
  int index;
  int j_3;
  int i_6;
  int i_5;
  int nz;
  int iStack_110;
  bool diagonal_non_zero;
  int p;
  int j_2;
  int i_4;
  int slice_len_1;
  int k_1;
  double *mat_b22_tmp;
  int z;
  int j_1;
  int i_3;
  vector<double,_std::allocator<double>_> mat_b33;
  int slice_len;
  int k;
  int q;
  int i_2;
  double *entry;
  int local_b0;
  int i_1;
  int iteration;
  int max_iterations;
  int j;
  int i;
  double *mat_b;
  double *mat_q;
  double *mat_p;
  double *mat_b_full;
  double *mat_q_full;
  allocator<double> local_61;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> buffer;
  int mat_b_size;
  int mat_q_size;
  int mat_p_size;
  int mat_b_full_size;
  int mat_q_full_size;
  double *mat_v_local;
  double *vec_s_local;
  double *mat_u_local;
  int cols_local;
  int rows_local;
  double *mat_a_local;
  
  buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = cols * cols;
  iVar3 = rows * rows + rows * cols + cols * cols + rows * cols +
          buffer.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage._4_4_;
  std::allocator<double>::allocator(&local_61);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,(long)iVar3,&local_61);
  std::allocator<double>::~allocator(&local_61);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,0);
  pdVar6 = pvVar5 + rows * rows;
  mat_v_00 = pdVar6 + rows * cols;
  mat_q_00 = mat_v_00 + cols * cols;
  __result = mat_q_00 + rows * cols;
  matrix_bidiagonalize<double>(mat_a,rows,cols,pvVar5,pdVar6,mat_v_00,epsilon);
  for (max_iterations = 0; max_iterations < rows; max_iterations = max_iterations + 1) {
    for (iteration = 0; iteration < cols; iteration = iteration + 1) {
      mat_q_00[max_iterations * cols + iteration] = pvVar5[max_iterations * rows + iteration];
    }
  }
  std::copy<double*,double*>(pdVar6,pdVar6 + (uint)(cols * cols),__result);
  local_b0 = 0;
  while (local_b0 < rows * cols) {
    local_b0 = local_b0 + 1;
    for (entry._4_4_ = 0; entry._4_4_ < cols * cols; entry._4_4_ = entry._4_4_ + 1) {
      if ((0.0 - *epsilon <= __result[entry._4_4_]) && (__result[entry._4_4_] <= *epsilon + 0.0)) {
        __result[entry._4_4_] = 0.0;
      }
    }
    for (k = 0; k < cols + -1; k = k + 1) {
      std::abs((int)pdVar6);
      dVar1 = *epsilon;
      std::abs((int)pdVar6);
      if (extraout_XMM0_Qa <= dVar1 * extraout_XMM0_Qa_00) {
        __result[k * cols + k + 1] = 0.0;
      }
    }
    slice_len = 0;
    for (mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
         ._M_end_of_storage._4_4_ = 0;
        mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ < cols;
        mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
      mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._0_4_ =
           mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
      uVar4 = (int)mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage *
              (int)mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
      std::allocator<double>::allocator((allocator<double> *)((long)&j_1 + 3));
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&i_3,(ulong)uVar4,
                 (allocator<double> *)((long)&j_1 + 3));
      std::allocator<double>::~allocator((allocator<double> *)((long)&j_1 + 3));
      for (z = 0; z < (int)mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage; z = z + 1) {
        for (mat_b22_tmp._4_4_ = 0;
            mat_b22_tmp._4_4_ <
            (int)mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            mat_b22_tmp._4_4_ = mat_b22_tmp._4_4_ + 1) {
          dVar1 = __result[((cols - mat_b33.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) + -1 +
                           z) * cols +
                           (cols - mat_b33.super__Vector_base<double,_std::allocator<double>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) + -1 +
                           mat_b22_tmp._4_4_];
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&i_3,
                              (long)(z * (int)mat_b33.
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_end_of_storage +
                                    mat_b22_tmp._4_4_));
          *pvVar5 = dVar1;
        }
      }
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&i_3,0);
      bVar2 = matrix_is_diagonal<double>
                        (pvVar5,(int)mat_b33.super__Vector_base<double,_std::allocator<double>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (int)mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,epsilon);
      if (bVar2) {
        if (mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ < cols + -1) {
          bVar2 = matrix_is_submatrix_zero_enclosed<double>
                            (__result,cols,
                             mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_ + 1,epsilon);
          if (bVar2) {
            slice_len = mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          }
        }
        else {
          slice_len = mat_b33.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
        }
      }
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)&i_3);
    }
    mat_b22_tmp._0_4_ = 0;
    pdVar6 = (double *)operator_new__((ulong)(uint)((cols - slice_len) * (cols - slice_len)) << 3);
    for (i_4 = 0; i_4 < cols - slice_len; i_4 = i_4 + 1) {
      iVar3 = i_4 + 1;
      for (p = 0; p < iVar3; p = p + 1) {
        for (iStack_110 = 0; iStack_110 < iVar3; iStack_110 = iStack_110 + 1) {
          pdVar6[p * iVar3 + iStack_110] =
               __result[(((cols - slice_len) - i_4) + -1 + p) * cols +
                        ((cols - slice_len) - i_4) + -1 + iStack_110];
        }
      }
      bVar2 = matrix_is_superdiagonal_nonzero<double>(pdVar6,iVar3,iVar3,epsilon);
      if (bVar2) {
        mat_b22_tmp._0_4_ = i_4 + 1;
      }
    }
    if (pdVar6 != (double *)0x0) {
      operator_delete__(pdVar6);
    }
    iVar3 = (cols - slice_len) - (int)mat_b22_tmp;
    if (slice_len == cols) break;
    bVar2 = true;
    for (i_6 = iVar3; i_6 < (cols - slice_len) + -1; i_6 = i_6 + 1) {
      if ((0.0 - *epsilon <= __result[i_6 * cols + i_6]) &&
         (__result[i_6 * cols + i_6] <= *epsilon + 0.0)) {
        bVar2 = false;
        __result[i_6 * cols + i_6] = 0.0;
        break;
      }
    }
    if (bVar2) {
      pdVar6 = (double *)(ulong)(uint)rows;
      matrix_gk_svd_step<double>(rows,cols,__result,mat_q_00,mat_v_00,iVar3,slice_len,epsilon);
    }
    else {
      pdVar6 = (double *)(ulong)(uint)rows;
      matrix_svd_clear_super_entry<double>(rows,cols,__result,mat_q_00,i_6,epsilon);
    }
  }
  std::copy<double*,double*>(mat_q_00,mat_q_00 + rows * cols,mat_u);
  std::copy<double*,double*>(mat_v_00,mat_v_00 + (uint)(cols * cols),mat_v);
  for (j_3 = 0; j_3 < cols; j_3 = j_3 + 1) {
    vec_s[j_3] = __result[j_3 * cols + j_3];
  }
  for (index = 0; index < cols; index = index + 1) {
    if (vec_s[index] < *epsilon) {
      vec_s[index] = -vec_s[index];
      for (local_128 = 0; local_128 < rows; local_128 = local_128 + 1) {
        iVar3 = local_128 * cols + index;
        mat_u[iVar3] = -mat_u[iVar3];
      }
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  return;
}

Assistant:

void
matrix_gk_svd (T const* mat_a, int rows, int cols,
    T* mat_u, T* vec_s, T* mat_v, T const& epsilon)
{
    /* Allocate memory for temp matrices. */
    int const mat_q_full_size = rows * rows;
    int const mat_b_full_size = rows * cols;
    int const mat_p_size = cols * cols;
    int const mat_q_size = rows * cols;
    int const mat_b_size = cols * cols;

    std::vector<T> buffer(mat_q_full_size + mat_b_full_size
        + mat_p_size + mat_q_size + mat_b_size);
    T* mat_q_full = &buffer[0];
    T* mat_b_full = mat_q_full + mat_q_full_size;
    T* mat_p = mat_b_full + mat_b_full_size;
    T* mat_q = mat_p + mat_p_size;
    T* mat_b = mat_q + mat_q_size;

    matrix_bidiagonalize(mat_a, rows, cols,
        mat_q_full, mat_b_full, mat_p, epsilon);

    /* Extract smaller matrices. */
    for (int i = 0; i < rows; ++i)
    {
        for (int j = 0; j < cols; ++j)
        {
            mat_q[i * cols + j] = mat_q_full[i * rows + j];
        }
    }
    std::copy(mat_b_full, mat_b_full + cols * cols, mat_b);

    /* Avoid infinite loops and exit after maximum number of iterations. */
    int const max_iterations = rows * cols;
    int iteration = 0;
    while (iteration < max_iterations)
    {
        iteration += 1;

        /* Enforce exact zeros for numerical stability. */
        for (int i = 0; i < cols * cols; ++i)
        {
            T const& entry = mat_b[i];
            if (MATH_EPSILON_EQ(entry, T(0), epsilon))
                mat_b[i] = T(0);
        }

        /* GK 2a. */
        for (int i = 0; i < (cols - 1); ++i)
        {
            if (std::abs(mat_b[i * cols + (i + 1)]) <= epsilon *
                std::abs(mat_b[i * cols + i] + mat_b[(i + 1) * cols + (i + 1)]))
            {
                mat_b[i * cols + (i + 1)] = T(0);
            }
        }

        /* GK 2b. */
        /* Select q such that b33 is diagonal and blocked by zeros. */
        int q = 0;
        for (int k = 0; k < cols; ++k)
        {
            int const slice_len = k + 1;
            std::vector<T> mat_b33(slice_len * slice_len);
            for (int i = 0; i < slice_len; ++i)
            {
                for (int j = 0; j < slice_len; ++j)
                {
                    mat_b33[i * slice_len + j]
                        = mat_b[(cols - k - 1 + i) * cols + (cols - k - 1 + j)];
                }
            }

            if (matrix_is_diagonal(&mat_b33[0], slice_len, slice_len, epsilon))
            {
                if (k < cols - 1)
                {
                    if (matrix_is_submatrix_zero_enclosed(
                        mat_b, cols, k + 1, epsilon))
                    {
                        q = k + 1;
                    }
                }
                else
                {
                    q = k + 1;
                }
            }
        }

        /* Select z := n-p-q such that B22 has no zero superdiagonal entry. */
        int z = 0;
        T* mat_b22_tmp = new T[(cols - q) * (cols - q)];
        for (int k = 0; k < (cols - q); ++k)
        {
            int const slice_len = k + 1;
            for (int i = 0; i < slice_len; ++i)
            {
                for (int j = 0; j < slice_len; ++j)
                {
                    mat_b22_tmp[i * slice_len + j]
                        = mat_b[(cols - q - k - 1 + i)
                        * cols + (cols - q - k - 1 + j)];
                }
            }
            if (matrix_is_superdiagonal_nonzero(
                mat_b22_tmp, slice_len, slice_len, epsilon))
            {
                z = k + 1;
            }
        }
        delete[] mat_b22_tmp;

        int const p = cols - q - z;

        /* GK 2c. */
        if (q == cols)
            break;

        bool diagonal_non_zero = true;
        int nz = 0;
        for (nz = p; nz < (cols - q - 1); ++nz)
        {
            if (MATH_EPSILON_EQ(mat_b[nz * cols + nz], T(0), epsilon))
            {
                diagonal_non_zero = false;
                mat_b[nz * cols + nz] = T(0);
                break;
            }
        }

        if (diagonal_non_zero)
            matrix_gk_svd_step(rows, cols, mat_b, mat_q, mat_p, p, q, epsilon);
        else
            matrix_svd_clear_super_entry(rows, cols, mat_b, mat_q, nz, epsilon);
    }

    /* Create resulting matrices and vector from temporary entities. */
    std::copy(mat_q, mat_q + rows * cols, mat_u);
    std::copy(mat_p, mat_p + cols * cols, mat_v);
    for (int i = 0; i < cols; ++i)
        vec_s[i] = mat_b[i * cols + i];

    /* Correct signs. */
    for (int i = 0; i < cols; ++i)
    {
        if (vec_s[i] < epsilon)
        {
            vec_s[i] = -vec_s[i];
            for (int j = 0; j < rows; ++j)
            {
                int index = j * cols + i;
                mat_u[index] = -mat_u[index];
            }
        }
    }
}